

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

wchar_t format_function_key(char *buf,Terminal *term,wchar_t key_number,_Bool shift,_Bool ctrl,
                           _Bool alt,_Bool *consumed_alt)

{
  wchar_t wVar1;
  uint uVar2;
  wchar_t wVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  bool bVar8;
  
  uVar5 = (uint)shift;
  if (key_number < L'\x01') {
    __assert_fail("key_number > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x1cfb,
                  "int format_function_key(char *, Terminal *, int, _Bool, _Bool, _Bool, _Bool *)");
  }
  if (0x14 < (uint)key_number) {
    __assert_fail("key_number < lenof(key_number_to_tilde_code)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x1cfc,
                  "int format_function_key(char *, Terminal *, int, _Bool, _Bool, _Bool, _Bool *)");
  }
  wVar3 = term->funky_type;
  if ((uint)(wVar3 + L'\xfffffffb') < 2) {
    if (wVar3 == L'\x05') {
      uVar5 = key_number + L'\xffffffff';
      if (0xc < (uint)key_number) {
        uVar5 = 0;
      }
      uVar2 = uVar5 + 0xc;
      if (!shift) {
        uVar2 = uVar5;
      }
      uVar5 = uVar2 + 0x18;
      if (!ctrl) {
        uVar5 = uVar2;
      }
      uVar6 = (ulong)(uint)(int)"MNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz@[\\]^_`{"[uVar5];
      pcVar7 = "\x1b[%c";
      goto LAB_0010fa8c;
    }
  }
  else {
    bVar8 = (uint)key_number < 0xb;
    wVar1 = key_number + L'\n';
    if (!bVar8 || !shift) {
      wVar1 = key_number;
    }
    key_number = wVar1;
    uVar5 = (uint)((bVar8 && shift) != shift);
  }
  uVar6 = (ulong)(uint)key_number;
  uVar2 = format_function_key::key_number_to_tilde_code[uVar6];
  if (term->vt52_mode == false) {
    if ((wVar3 != L'\x04') || (0xc < (uint)key_number)) {
      if ((wVar3 != L'\x01') || (5 < (uint)key_number)) goto LAB_0010fa24;
      uVar2 = uVar2 + 0x36;
      pcVar7 = "\x1b[[%c";
      goto LAB_0010fa8a;
    }
    pcVar7 = "\x1bO%c";
  }
  else {
    if (0xc < (uint)key_number) {
LAB_0010fa24:
      if ((wVar3 | 4U) == 6) {
        if ((uint)key_number < 5) {
          if (term->vt52_mode == false) {
            if (wVar3 == L'\x06') {
              if (alt && consumed_alt != (_Bool *)0x0) {
                *consumed_alt = true;
              }
              uVar5 = (uint)ctrl * 4 + (uint)alt * 2 | uVar5;
              if (uVar5 != 0) {
                uVar4 = uVar2 + 0x45;
                pcVar7 = "\x1b[1;%d%c";
                uVar2 = uVar5 + 1;
                goto LAB_0010fad3;
              }
            }
            uVar2 = uVar2 + 0x45;
            pcVar7 = "\x1bO%c";
          }
          else {
            uVar2 = uVar2 + 0x45;
            pcVar7 = "\x1b%c";
          }
          goto LAB_0010fa8a;
        }
        if (wVar3 == L'\x06') {
          if (alt && consumed_alt != (_Bool *)0x0) {
            *consumed_alt = true;
          }
          uVar5 = (uint)ctrl * 4 + (uint)alt * 2 | uVar5;
          if (uVar5 != 0) {
            uVar4 = uVar5 + 1;
            pcVar7 = "\x1b[%d;%d~";
LAB_0010fad3:
            wVar3 = sprintf(buf,pcVar7,(ulong)uVar2,(ulong)uVar4);
            return wVar3;
          }
        }
      }
      pcVar7 = "\x1b[%d~";
LAB_0010fa8a:
      uVar6 = (ulong)uVar2;
      goto LAB_0010fa8c;
    }
    pcVar7 = "\x1b%c";
  }
  uVar4 = (uint)(uVar6 - 6 < 0xf);
  uVar5 = ~uVar4;
  if (9 < uVar6 - 0xb) {
    uVar5 = -uVar4;
  }
  uVar6 = (ulong)(uVar2 + uVar5 + 0x45);
LAB_0010fa8c:
  wVar3 = sprintf(buf,pcVar7,uVar6);
  return wVar3;
}

Assistant:

int format_function_key(char *buf, Terminal *term, int key_number,
                        bool shift, bool ctrl, bool alt, bool *consumed_alt)
{
    char *p = buf;

    static const int key_number_to_tilde_code[] = {
        -1,                 /* no such key as F0 */
        11, 12, 13, 14, 15, /*gap*/ 17, 18, 19, 20, 21, /*gap*/
        23, 24, 25, 26, /*gap*/ 28, 29, /*gap*/ 31, 32, 33, 34,
    };

    assert(key_number > 0);
    assert(key_number < lenof(key_number_to_tilde_code));

    int index = key_number;
    if (term->funky_type != FUNKY_XTERM_216 && term->funky_type != FUNKY_SCO) {
        if (shift && index <= 10) {
            shift = false;
            index += 10;
        }
    }

    int code = key_number_to_tilde_code[index];

    if (term->funky_type == FUNKY_SCO) {
        /* SCO function keys */
        static const char sco_codes[] =
            "MNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz@[\\]^_`{";
        index = (key_number >= 1 && key_number <= 12) ? key_number - 1 : 0;
        if (shift) index += 12;
        if (ctrl) index += 24;
        p += sprintf(p, "\x1B[%c", sco_codes[index]);
    } else if ((term->vt52_mode || term->funky_type == FUNKY_VT100P) &&
               code >= 11 && code <= 24) {
        int offt = 0;
        if (code > 15)
            offt++;
        if (code > 21)
            offt++;
        if (term->vt52_mode)
            p += sprintf(p, "\x1B%c", code + 'P' - 11 - offt);
        else
            p += sprintf(p, "\x1BO%c", code + 'P' - 11 - offt);
    } else if (term->funky_type == FUNKY_LINUX && code >= 11 && code <= 15) {
        p += sprintf(p, "\x1B[[%c", code + 'A' - 11);
    } else if ((term->funky_type == FUNKY_XTERM ||
                term->funky_type == FUNKY_XTERM_216) &&
               code >= 11 && code <= 14) {
        if (term->vt52_mode)
            p += sprintf(p, "\x1B%c", code + 'P' - 11);
        else {
            int bitmap = 0;
            if (term->funky_type == FUNKY_XTERM_216)
                bitmap = shift_bitmap(shift, ctrl, alt, consumed_alt);
            if (bitmap)
                p += sprintf(p, "\x1B[1;%d%c", bitmap, code + 'P' - 11);
            else
                p += sprintf(p, "\x1BO%c", code + 'P' - 11);
        }
    } else {
        int bitmap = 0;
        if (term->funky_type == FUNKY_XTERM_216)
            bitmap = shift_bitmap(shift, ctrl, alt, consumed_alt);
        if (bitmap)
            p += sprintf(p, "\x1B[%d;%d~", code, bitmap);
        else
            p += sprintf(p, "\x1B[%d~", code);
    }

    return p - buf;
}